

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer.cpp
# Opt level: O3

void __thiscall Randomizer::Randomizer(Randomizer *this)

{
  ulong uVar1;
  mt19937 *pmVar2;
  param_type *ppVar3;
  param_type *ppVar4;
  size_t __i;
  long lVar5;
  
  uVar1 = std::chrono::_V2::system_clock::now();
  pmVar2 = (mt19937 *)operator_new(5000);
  uVar1 = uVar1 & 0xffffffff;
  pmVar2->_M_x[0] = uVar1;
  lVar5 = 1;
  do {
    uVar1 = (ulong)(((uint)(uVar1 >> 0x1e) ^ (uint)uVar1) * 0x6c078965 + (int)lVar5);
    pmVar2->_M_x[lVar5] = uVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  pmVar2->_M_p = 0x270;
  this->RndCore = pmVar2;
  ppVar3 = (param_type *)operator_new(8);
  ppVar3->_M_a = 0.0;
  ppVar3->_M_b = 60.0;
  this->XAxisRnd = (uniform_real_distribution<float> *)ppVar3;
  ppVar3 = (param_type *)operator_new(8);
  ppVar3->_M_a = 0.0;
  ppVar3->_M_b = 90.0;
  this->YAxisRnd = (uniform_real_distribution<float> *)ppVar3;
  ppVar3 = (param_type *)operator_new(8);
  ppVar3->_M_a = 0.0;
  ppVar3->_M_b = 362880.0;
  this->RespawnRnd = (uniform_real_distribution<float> *)ppVar3;
  ppVar4 = (param_type *)operator_new(8);
  ppVar4->_M_a = 10;
  ppVar4->_M_b = 0x14;
  this->WanderRnd = (uniform_int_distribution<int> *)ppVar4;
  return;
}

Assistant:

Randomizer::Randomizer()
{
    auto seed = chrono::system_clock::now().time_since_epoch().count();
    RndCore = new mt19937(seed);
    XAxisRnd = new uniform_real_distribution<float>(0, MapWidth);
    YAxisRnd = new uniform_real_distribution<float>(0, MapHeight);
    RespawnRnd = new uniform_real_distribution<float>(0, RespawnRndMax);
    WanderRnd = new uniform_int_distribution<int>(WanderIntervalLB, WanderIntervalUB);
}